

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralItem::~IfcStructuralItem(IfcStructuralItem *this)

{
  ~IfcStructuralItem(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

IfcStructuralItem() : Object("IfcStructuralItem") {}